

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FboUtil::addExtFormats
          (FboUtil *this,FormatDB *db,FormatExtEntries extFmts,RenderContext *ctx)

{
  char *__s;
  undefined8 ctx_00;
  bool bVar1;
  FormatExtEntry *pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  ContextInfo *ctxInfo_00;
  reference extension;
  uint *puVar3;
  ImageFormat format;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  ContextInfo *local_2c8;
  FormatKey *local_2b8;
  FormatKey *i2;
  _Self local_2a8;
  const_iterator extIt;
  undefined1 local_290 [8];
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  tokens;
  string local_228 [32];
  istringstream local_208 [8];
  istringstream tokenStream;
  undefined1 local_88 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExtensions;
  bool supported;
  FormatExtEntry *local_48;
  FormatExtEntry *entryIt;
  undefined1 local_38 [8];
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  RenderContext *ctx_local;
  FormatDB *db_local;
  FormatExtEntries extFmts_local;
  
  ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
       extFmts.m_end;
  extFmts_local.m_begin = extFmts.m_begin;
  db_local = db;
  if ((FormatExtEntry *)
      ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_
      == (FormatExtEntry *)0x0) {
    local_2c8 = (ContextInfo *)0x0;
  }
  else {
    local_2c8 = glu::ContextInfo::create
                          ((RenderContext *)
                           ctxInfo.
                           super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                           .m_data._8_8_);
  }
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter
            ((DefaultDeleter<glu::ContextInfo> *)((long)&entryIt + 7));
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_38,
             local_2c8);
  local_48 = Range<deqp::gls::FboUtil::FormatExtEntry>::begin
                       ((Range<deqp::gls::FboUtil::FormatExtEntry> *)&db_local);
  do {
    pFVar2 = Range<deqp::gls::FboUtil::FormatExtEntry>::end
                       ((Range<deqp::gls::FboUtil::FormatExtEntry> *)&db_local);
    if (local_48 == pFVar2) {
      de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
                ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_38);
      return;
    }
    requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_88);
    __s = local_48->extensions;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_228,__s,(allocator<char> *)&tokens.field_0x2f);
    std::__cxx11::istringstream::istringstream(local_208,local_228,_S_in);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&tokens.field_0x2f);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)&end._M_ok,(istream_type *)local_208);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)local_290);
    while (bVar1 = std::operator!=((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                                    *)&end._M_ok,
                                   (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                                    *)local_290), bVar1) {
      __x = std::
            istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
            ::operator*((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                         *)&end._M_ok);
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88,__x);
      extIt._M_node = (_Base_ptr)pVar4.first._M_node;
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::operator++((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                    *)&end._M_ok);
    }
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                         *)local_290);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                         *)&end._M_ok);
    std::__cxx11::istringstream::~istringstream(local_208);
    bVar1 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)local_38);
    if (bVar1) {
      local_2a8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
      while( true ) {
        i2 = (FormatKey *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
        bVar1 = std::operator!=(&local_2a8,(_Self *)&i2);
        if (!bVar1) break;
        ctxInfo_00 = de::details::
                     UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::operator*
                               ((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                                 *)local_38);
        ctx_00 = ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_;
        extension = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_2a8);
        bVar1 = checkExtensionSupport(ctxInfo_00,(RenderContext *)ctx_00,extension);
        if (!bVar1) {
          requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
          break;
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_2a8);
      }
    }
    if ((requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) != 0) {
      for (local_2b8 = Range<unsigned_int>::begin(&local_48->formats);
          puVar3 = Range<unsigned_int>::end(&local_48->formats), local_2b8 != puVar3;
          local_2b8 = local_2b8 + 1) {
        format = formatKeyInfo(*local_2b8);
        FormatDB::addExtensionFormat
                  ((FormatDB *)this,format,local_48->flags,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
      }
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void addExtFormats (FormatDB& db, FormatExtEntries extFmts, const RenderContext* ctx)
{
	const UniquePtr<ContextInfo> ctxInfo(ctx != DE_NULL ? ContextInfo::create(*ctx) : DE_NULL);
	for (const FormatExtEntry* entryIt = extFmts.begin(); entryIt != extFmts.end(); entryIt++)
	{
		bool					supported			= true;
		std::set<std::string>	requiredExtensions;

		// parse required extensions
		{
			istringstream tokenStream(string(entryIt->extensions));
			istream_iterator<string> tokens((tokenStream)), end;

			while (tokens != end)
			{
				requiredExtensions.insert(*tokens);
				++tokens;
			}
		}

		// check support
		if (ctxInfo)
		{
			for (std::set<std::string>::const_iterator extIt = requiredExtensions.begin(); extIt != requiredExtensions.end(); ++extIt)
			{
				if (!checkExtensionSupport(*ctxInfo, *ctx, *extIt))
				{
					supported = false;
					break;
				}
			}
		}

		if (supported)
			for (const FormatKey* i2 = entryIt->formats.begin(); i2 != entryIt->formats.end(); i2++)
				db.addExtensionFormat(formatKeyInfo(*i2), FormatFlags(entryIt->flags), requiredExtensions);
	}
}